

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O2

void __thiscall TextField::setString(TextField *this,string *s)

{
  int iVar1;
  Vector2f VVar2;
  locale alStack_68 [8];
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> local_60
  ;
  string local_40;
  
  std::__cxx11::string::substr((ulong)&local_40,(ulong)s);
  std::locale::locale(alStack_68);
  sf::String::String((String *)&local_60,&local_40,alStack_68);
  sf::Text::setString(&this->field,(String *)&local_60);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_60);
  std::locale::~locale(alStack_68);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = (int)s->_M_string_length;
  if (this->maxCharacters < iVar1) {
    iVar1 = this->maxCharacters;
  }
  this->caretPosition = iVar1;
  VVar2 = sf::Text::findCharacterPos(&this->field,(long)iVar1);
  sf::Transformable::setPosition(&(this->caret).super_Shape.super_Transformable,VVar2.x,2.0);
  return;
}

Assistant:

void TextField::setString(const string& s) {
    field.setString(s.substr(0, maxCharacters));
    caretPosition = min(maxCharacters, static_cast<int>(s.length()));
    caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
}